

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

bool glcts::verifyResultImage<float,4u,3u,3u>
               (GLuint n_mipmap_levels,GLuint n_layers,
               _func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *getComponents,GLubyte *data)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  GLuint pixel;
  long lVar5;
  GLuint GVar6;
  GLuint face;
  int iVar7;
  vector<float,_std::allocator<float>_> expected_values;
  float components [4];
  vector<float,_std::allocator<float>_> local_78;
  float *local_60;
  ulong local_58;
  _func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *local_50;
  float local_48 [6];
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50 = getComponents;
  std::vector<float,_std::allocator<float>_>::resize(&local_78,(ulong)(n_layers * 0xd8));
  local_60 = (float *)data;
  if (n_layers != 0) {
    uVar2 = 0;
    GVar6 = 0;
    do {
      iVar7 = 0;
      local_58 = uVar2;
      do {
        iVar4 = (int)uVar2;
        lVar5 = 0;
        do {
          (*local_50)((GLuint)lVar5,iVar7,GVar6,n_layers,n_mipmap_levels,local_48);
          lVar3 = 0;
          do {
            local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2 + lVar3] = local_48[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          lVar5 = lVar5 + 1;
          uVar2 = (ulong)((int)uVar2 + 4);
        } while (lVar5 != 9);
        iVar7 = iVar7 + 1;
        uVar2 = (ulong)(iVar4 + 0x24);
      } while (iVar7 != 6);
      GVar6 = GVar6 + 1;
      uVar2 = (ulong)((int)local_58 + 0xd8);
    } while (GVar6 != n_layers);
  }
  bVar1 = verifyImage<float,4u,3u,3u>
                    (local_60,local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,n_layers);
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool verifyResultImage(glw::GLuint n_mipmap_levels, glw::GLuint n_layers,
					   void (*getComponents)(glw::GLuint pixel_index, glw::GLint cube_face, glw::GLint layer_index,
											 glw::GLint n_layers, glw::GLint n_mipmap_levels, T* out_components),
					   const glw::GLubyte* data)
{
	const glw::GLuint n_components			= N_Components;
	const glw::GLuint face_width			= Width;
	const glw::GLuint face_height			= Height;
	const glw::GLuint n_pixels_per_face		= face_width * face_height;
	const glw::GLuint n_components_per_face = n_pixels_per_face * n_components;
	const glw::GLuint n_faces				= 6;
	const glw::GLuint n_total_faces			= n_layers * n_faces;
	const glw::GLuint n_total_components	= n_total_faces * n_components_per_face;
	const T*		  result_image			= (const T*)data;

	std::vector<T> expected_values;
	expected_values.resize(n_total_components);

	for (glw::GLuint layer = 0; layer < n_layers; ++layer)
	{
		const glw::GLuint layer_offset = layer * n_faces * n_components_per_face;

		for (glw::GLuint face = 0; face < n_faces; ++face)
		{
			const glw::GLuint face_offset = face * n_components_per_face + layer_offset;

			for (glw::GLuint pixel = 0; pixel < n_pixels_per_face; ++pixel)
			{
				const glw::GLuint pixel_offset = pixel * n_components + face_offset;

				T components[n_components];

				getComponents(pixel, face, layer, n_layers, n_mipmap_levels, components);

				for (glw::GLuint component = 0; component < n_components; ++component)
				{
					const glw::GLuint component_offset = pixel_offset + component;

					expected_values[component_offset] = components[component];
				}
			}
		}
	}

	return verifyImage<T, N_Components, Width, Height>(result_image, &expected_values[0], n_layers);
}